

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O3

int __thiscall
rengine::Signal<int>::connect(Signal<int> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  iterator __position;
  iterator __position_00;
  int iVar1;
  int extraout_EAX;
  undefined **ppuVar2;
  BucketBase *pBVar3;
  vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
  *extraout_RAX;
  undefined4 in_register_00000034;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *__range2;
  vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
  *this_00;
  sockaddr *local_40;
  SignalHandler<int> *handler_local;
  
  this_00 = *(vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
              **)(CONCAT44(in_register_00000034,__fd) + 8);
  local_40 = __addr;
  if (this_00 !=
      (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
       *)0x0) {
    for (ppuVar2 = *(undefined ***)this_00;
        (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
         *)ppuVar2 !=
        *(vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
          **)(this_00 + 8); ppuVar2 = (undefined **)((long)ppuVar2 + 8)) {
      pBVar3 = (BucketBase *)*ppuVar2;
      if (pBVar3->signal == &this->super_SignalBase) goto LAB_0010f034;
    }
  }
  pBVar3 = (BucketBase *)operator_new(0x28);
  ppuVar2 = &PTR__Bucket_00115cf0;
  pBVar3->_vptr_BucketBase = (_func_int **)&PTR__Bucket_00115cf0;
  pBVar3[1]._vptr_BucketBase = (_func_int **)0x0;
  pBVar3[1].signal = (SignalBase *)0x0;
  pBVar3[2]._vptr_BucketBase = (_func_int **)0x0;
  pBVar3->signal = &this->super_SignalBase;
  if (this_00 ==
      (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
       *)0x0) {
    ppuVar2 = (undefined **)operator_new(0x18);
    *ppuVar2 = (undefined *)0x0;
    *(undefined **)((long)ppuVar2 + 8) = (undefined *)0x0;
    *(undefined **)((long)ppuVar2 + 0x10) = (undefined *)0x0;
    *(undefined ***)(CONCAT44(in_register_00000034,__fd) + 8) = ppuVar2;
    this_00 = (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
               *)ppuVar2;
  }
  __position._M_current = *(BucketBase ***)(this_00 + 8);
  handler_local = (SignalHandler<int> *)pBVar3;
  if (__position._M_current == *(BucketBase ***)(this_00 + 0x10)) {
    std::
    vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
    ::_M_realloc_insert<rengine::SignalEmitter::BucketBase*>
              (this_00,__position,(BucketBase **)&handler_local);
    ppuVar2 = (undefined **)extraout_RAX;
  }
  else {
    *__position._M_current = pBVar3;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
LAB_0010f034:
  iVar1 = (int)ppuVar2;
  __position_00._M_current = (SignalHandler<int> **)pBVar3[1].signal;
  if (__position_00._M_current == (SignalHandler<int> **)pBVar3[2]._vptr_BucketBase) {
    std::vector<rengine::SignalHandler<int>*,std::allocator<rengine::SignalHandler<int>*>>::
    _M_realloc_insert<rengine::SignalHandler<int>*const&>
              ((vector<rengine::SignalHandler<int>*,std::allocator<rengine::SignalHandler<int>*>> *)
               (pBVar3 + 1),__position_00,(SignalHandler<int> **)&local_40);
    iVar1 = extraout_EAX;
  }
  else {
    *__position_00._M_current = (SignalHandler<int> *)__addr;
    pBVar3[1].signal = pBVar3[1].signal + 1;
  }
  return iVar1;
}

Assistant:

void connect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        if (!bucket) {
            bucket = new Bucket();
            bucket->signal = this;
            if (!emitter->m_buckets) {
                emitter->m_buckets = new std::vector<SignalEmitter::BucketBase *>();
            }
            emitter->m_buckets->push_back(bucket);
        }
        bucket->handlers.push_back(handler);
    }